

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Sprs_array_col_block_list(int s_a,int **idx,int *n)

{
  void *pvVar1;
  Integer **in_RDX;
  long *in_RSI;
  Integer sa;
  Integer N;
  Integer i;
  Integer *Idx;
  long local_30;
  long local_28;
  Integer *in_stack_ffffffffffffffe0;
  
  pnga_sprs_array_col_block_list((Integer)in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  *(int *)in_RDX = (int)local_30;
  pvVar1 = malloc(local_30 << 2);
  *in_RSI = (long)pvVar1;
  for (local_28 = 0; local_28 < local_30; local_28 = local_28 + 1) {
    *(int *)(*in_RSI + local_28 * 4) = (int)in_stack_ffffffffffffffe0[local_28];
  }
  free(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void NGA_Sprs_array_col_block_list(int s_a, int **idx, int *n)
{
  Integer *Idx;
  Integer i,N;
  Integer sa = s_a;
  wnga_sprs_array_col_block_list(sa, &Idx, &N);
  *n = N;
  *idx = (int*)malloc(N*sizeof(int));
  for (i=0; i<N; i++) {
    (*idx)[i] = (int)(Idx[i]);
  }
  free(Idx);
}